

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.h
# Opt level: O1

Nonnull<const_char_*> absl::lts_20250127::StatusMessageAsCStr(Status *status)

{
  ulong uVar1;
  ulong uVar2;
  char *pcVar3;
  Nonnull<const_char_*> pcVar4;
  
  uVar1 = status->rep_;
  if ((uVar1 & 1) == 0) {
    pcVar4 = *(Nonnull<const_char_*> *)(uVar1 + 8);
    uVar2 = *(ulong *)(uVar1 + 0x10);
  }
  else {
    uVar2 = uVar1 & 2;
    pcVar4 = (Nonnull<const_char_*>)((long)(uVar1 << 0x3e) >> 0x3f & 0x3e4e70);
  }
  pcVar3 = "";
  if (uVar2 != 0) {
    pcVar3 = pcVar4;
  }
  return pcVar3;
}

Assistant:

inline absl::string_view Status::message() const {
  return !IsInlined(rep_)
             ? RepToPointer(rep_)->message()
             : (IsMovedFrom(rep_) ? absl::string_view(kMovedFromString)
                                  : absl::string_view());
}